

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZHybridizeHDiv.cpp
# Opt level: O3

tuple<long,_int> __thiscall
TPZHybridizeHDiv::SplitConnects
          (TPZHybridizeHDiv *this,TPZCompElSide *left,TPZStack<TPZCompElSide,_10> *cellsidestack,
          TPZVec<TPZCompMesh_*> *meshvec_Hybrid,bool isIntersectEnd)

{
  long lVar1;
  byte bVar2;
  uchar uVar3;
  TPZCompMesh *mesh;
  TPZCompMesh **ppTVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  TPZHybridizeHDiv *pTVar7;
  undefined1 *puVar8;
  int iVar9;
  TPZCompEl *this_00;
  TPZConnect *pTVar10;
  long *plVar11;
  TPZGeoEl *pTVar12;
  TPZCompEl *pTVar13;
  TPZCompEl *this_01;
  TPZCompEl ***pppTVar14;
  TPZCompEl **ppTVar15;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  _Head_base<0UL,_long,_false> _Var16;
  undefined7 in_register_00000081;
  byte in_R9B;
  long lVar17;
  TPZCompElSide *celside;
  TPZCompElSide *right;
  TPZCompEl **ppTVar18;
  TPZCompElSide *pTVar19;
  long lVar20;
  tuple<long,_int> tVar21;
  TPZStack<TPZCompElSide,_10> *__range2;
  TPZGeoElBC gbc_1;
  TPZGeoElBC gbc;
  TPZCompElSide celside_1;
  TPZGeoElSide gleft;
  TPZManVector<TPZCompEl_*,_10> wrapvec;
  TPZGeoElBC local_170;
  TPZCompEl *local_168;
  TPZHybridizeHDiv *local_160;
  TPZCreateApproximationSpace *local_158;
  TPZGeoElSide local_150;
  TPZCompElSide local_138;
  undefined **local_128;
  undefined1 *local_120;
  ulong local_118;
  ulong local_110;
  undefined1 local_108 [80];
  TPZGeoElSide local_b8;
  TPZManVector<TPZCompEl_*,_10> local_a0;
  
  local_160 = this;
  if ((*(int *)&left->fEl == 0) || (*(int *)((long)&left->fEl + 4) == 0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Using uninitialized TPZHybridizeHDiv object. You need to call ComputePeriferalMaterialIds function first!"
               ,0x69);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZHybridizeHDiv.cpp"
               ,0xe1);
  }
  mesh = (TPZCompMesh *)**(undefined8 **)(CONCAT71(in_register_00000081,isIntersectEnd) + 8);
  TPZCompElSide::Reference(&local_b8,(TPZCompElSide *)cellsidestack);
  this_00 = (TPZCompEl *)
            __dynamic_cast((cellsidestack->super_TPZManVector<TPZCompElSide,_10>).
                           super_TPZVec<TPZCompElSide>._vptr_TPZVec,&TPZCompEl::typeinfo,
                           &TPZInterpolatedElement::typeinfo);
  (**(code **)(*(long *)this_00 + 0x2f8))
            (this_00,*(undefined4 *)
                      &(cellsidestack->super_TPZManVector<TPZCompElSide,_10>).
                       super_TPZVec<TPZCompElSide>.fStore,1);
  pTVar10 = TPZInterpolatedElement::SideConnect
                      ((TPZInterpolatedElement *)this_00,0,
                       *(int *)&(cellsidestack->super_TPZManVector<TPZCompElSide,_10>).
                                super_TPZVec<TPZCompElSide>.fStore);
  local_118 = meshvec_Hybrid->fNElements;
  local_128 = &PTR__TPZManVector_019e0db8;
  if ((long)local_118 < 0xb) {
    local_120 = local_108;
    local_110 = 0;
  }
  else {
    local_120 = (undefined1 *)operator_new__(-(ulong)(local_118 >> 0x3d != 0) | local_118 * 8);
    local_110 = local_118;
  }
  if (pTVar10->fDependList != (TPZDepend *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZHybridizeHDiv.cpp"
               ,0xf0);
  }
  if (local_118 != 0) {
    right = (TPZCompElSide *)meshvec_Hybrid->fStore;
    pTVar19 = right + local_118;
    lVar17 = 0;
    do {
      TPZCompElSide::SplitConnect((TPZCompElSide *)cellsidestack,right);
      if ((right->fEl == (TPZCompEl *)0x0) ||
         (plVar11 = (long *)__dynamic_cast(right->fEl,&TPZCompEl::typeinfo,
                                           &TPZInterpolatedElement::typeinfo,0),
         plVar11 == (long *)0x0)) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZHybridizeHDiv.cpp"
                   ,0xf8);
      }
      (**(code **)(*plVar11 + 0x2f8))(plVar11,right->fSide,1);
      *(long **)(local_120 + lVar17) = plVar11;
      right = right + 1;
      lVar17 = lVar17 + 8;
    } while (right != pTVar19);
  }
  bVar2 = (pTVar10->field_2).fCompose.fOrder;
  mesh->fDefaultOrder = (uint)bVar2;
  TPZManVector<TPZCompEl_*,_10>::TPZManVector(&local_a0,meshvec_Hybrid->fNElements);
  puVar8 = local_120;
  if (local_118 != 0) {
    lVar17 = local_118 << 3;
    lVar20 = 0;
    do {
      pTVar12 = TPZCompEl::Reference(*(TPZCompEl **)(puVar8 + lVar20));
      pTVar12->fReference = (TPZCompEl *)0x0;
      lVar20 = lVar20 + 8;
    } while (lVar17 != lVar20);
  }
  (**(code **)(*(long *)this_00 + 0x68))(this_00);
  (**(code **)(*(long *)this_00 + 0x2d8))(this_00,(uint)bVar2);
  TPZGeoElBC::TPZGeoElBC((TPZGeoElBC *)&local_150,&local_b8,*(int *)&left->fEl);
  local_158 = &mesh->fCreate;
  pTVar13 = TPZCreateApproximationSpace::CreateCompEl
                      (local_158,(TPZGeoEl *)local_150.super_TPZSavable._vptr_TPZSavable,mesh);
  if ((pTVar10->field_2).fCompose.fOrder == bVar2) {
    if (pTVar13 == (TPZCompEl *)0x0) {
      plVar11 = (long *)0x0;
    }
    else {
      plVar11 = (long *)__dynamic_cast(pTVar13,&TPZCompEl::typeinfo,
                                       &TPZInterpolatedElement::typeinfo,0);
    }
    iVar9 = (**(code **)(*local_150.super_TPZSavable._vptr_TPZSavable + 0xf0))();
    (**(code **)(*plVar11 + 0x2f8))(plVar11,iVar9 + -1,1);
    pTVar12 = TPZCompEl::Reference(this_00);
    pTVar12->fReference = (TPZCompEl *)0x0;
    pTVar12 = TPZCompEl::Reference(pTVar13);
    pTVar12->fReference = (TPZCompEl *)0x0;
    local_168 = pTVar13;
    pTVar12 = TPZCompEl::Reference(this_00);
    pTVar12->fReference = (TPZCompEl *)0x0;
    lVar17 = meshvec_Hybrid->fNElements;
    if (lVar17 != 0) {
      ppTVar4 = meshvec_Hybrid->fStore;
      lVar20 = 0;
      do {
        local_138.fEl = *(TPZCompEl **)((long)ppTVar4 + lVar20 * 2);
        local_138.fSide = *(int *)((long)ppTVar4 + lVar20 * 2 + 8);
        pTVar13 = *(TPZCompEl **)(local_120 + lVar20);
        (**(code **)(*(long *)pTVar13 + 0x68))(pTVar13);
        pTVar10 = TPZInterpolatedElement::SideConnect
                            ((TPZInterpolatedElement *)pTVar13,0,local_138.fSide);
        uVar3 = (pTVar10->field_2).fCompose.fOrder;
        (**(code **)(*(long *)pTVar13 + 0x2d8))(pTVar13,uVar3);
        TPZCompElSide::Reference(&local_150,&local_138);
        TPZGeoElBC::TPZGeoElBC(&local_170,&local_150,*(int *)&left->fEl);
        this_01 = TPZCreateApproximationSpace::CreateCompEl
                            (local_158,local_170.fCreatedElement,mesh);
        *(TPZCompEl **)((long)local_a0.super_TPZVec<TPZCompEl_*>.fStore + lVar20) = this_01;
        if ((pTVar10->field_2).fCompose.fOrder != uVar3) {
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZHybridizeHDiv.cpp"
                     ,0x124);
        }
        if (this_01 == (TPZCompEl *)0x0) {
          plVar11 = (long *)0x0;
        }
        else {
          plVar11 = (long *)__dynamic_cast(this_01,&TPZCompEl::typeinfo,
                                           &TPZInterpolatedElement::typeinfo,0);
        }
        iVar9 = (**(code **)(*(long *)local_170.fCreatedElement + 0xf0))();
        (**(code **)(*plVar11 + 0x2f8))(plVar11,iVar9 + -1,1);
        pTVar12 = TPZCompEl::Reference(pTVar13);
        pTVar12->fReference = (TPZCompEl *)0x0;
        pTVar12 = TPZCompEl::Reference(this_01);
        lVar1 = lVar20 * 2;
        pTVar12->fReference = (TPZCompEl *)0x0;
        lVar20 = lVar20 + 8;
      } while ((TPZCompMesh **)((long)ppTVar4 + lVar1 + 0x10) != ppTVar4 + lVar17 * 2);
    }
    (**(code **)(*(long *)local_168 + 0x68))();
    pppTVar14 = TPZVec<TPZCompEl_*>::begin(&local_a0.super_TPZVec<TPZCompEl_*>);
    ppTVar18 = *pppTVar14;
    ppTVar15 = TPZVec<TPZCompEl_*>::end(&local_a0.super_TPZVec<TPZCompEl_*>);
    for (; ppTVar18 != ppTVar15; ppTVar18 = ppTVar18 + 1) {
      (**(code **)(*(long *)*ppTVar18 + 0x68))();
    }
    TPZGeoElBC::TPZGeoElBC
              ((TPZGeoElBC *)&local_150,&local_b8,*(int *)((long)&left->fEl + (ulong)in_R9B * 4 + 4)
              );
    uVar5 = *(undefined4 *)(local_150.super_TPZSavable._vptr_TPZSavable + 6);
    uVar6 = *(undefined4 *)((long)(local_150.super_TPZSavable._vptr_TPZSavable + 6) + 4);
    (**(code **)(*(long *)this_00 + 0x68))();
    puVar8 = local_120;
    _Var16._M_head_impl = extraout_RDX;
    if (local_118 != 0) {
      lVar20 = local_118 << 3;
      lVar17 = 0;
      do {
        (**(code **)(**(long **)(puVar8 + lVar17) + 0x68))();
        lVar17 = lVar17 + 8;
        _Var16._M_head_impl = extraout_RDX_00;
      } while (lVar20 != lVar17);
    }
    pTVar7 = local_160;
    local_160->fHDivWrapMatid = (uint)bVar2;
    local_160->fLagrangeInterfaceEnd = uVar5;
    (local_160->fInterfaceMatid).first = uVar6;
    if (local_a0.super_TPZVec<TPZCompEl_*>.fStore != local_a0.fExtAlloc) {
      local_a0.super_TPZVec<TPZCompEl_*>.fNAlloc = 0;
      local_a0.super_TPZVec<TPZCompEl_*>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_018141f0;
      if (local_a0.super_TPZVec<TPZCompEl_*>.fStore != (TPZCompEl **)0x0) {
        operator_delete__(local_a0.super_TPZVec<TPZCompEl_*>.fStore);
        _Var16._M_head_impl = extraout_RDX_01;
      }
    }
    if (local_120 != local_108) {
      local_110 = 0;
      local_128 = &PTR__TPZVec_019e0d10;
      if (local_120 != (undefined1 *)0x0) {
        operator_delete__(local_120);
        _Var16._M_head_impl = extraout_RDX_02;
      }
    }
    tVar21.super__Tuple_impl<0UL,_long,_int>.super__Head_base<0UL,_long,_false>._M_head_impl =
         _Var16._M_head_impl;
    tVar21.super__Tuple_impl<0UL,_long,_int>._0_8_ = pTVar7;
    return (tuple<long,_int>)tVar21.super__Tuple_impl<0UL,_long,_int>;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZHybridizeHDiv.cpp"
             ,0x10c);
}

Assistant:

std::tuple<int64_t, int> TPZHybridizeHDiv::SplitConnects(const TPZCompElSide &left, const TPZStack<TPZCompElSide> &cellsidestack, TPZVec<TPZCompMesh *> &meshvec_Hybrid, const bool isIntersectEnd) {
    if (fHDivWrapMatid == 0 || fLagrangeInterface == 0) {
        std::cerr << "Using uninitialized TPZHybridizeHDiv object. You need to call ComputePeriferalMaterialIds function first!" << std::endl;
        DebugStop();
    }
    
    TPZCompMesh *fluxmesh = meshvec_Hybrid[0];
    
    // All left connect needed variables
    TPZGeoElSide gleft(left.Reference());
    TPZInterpolatedElement *intelleft = dynamic_cast<TPZInterpolatedElement *> (left.Element());
    intelleft->SetSideOrient(left.Side(), 1);
    
    TPZConnect &cleft = intelleft->SideConnect(0, left.Side());
    
    TPZManVector<TPZInterpolatedElement*> intelvec(cellsidestack.size());
    int count = 0;
    if (cleft.HasDependency()){
        DebugStop(); // Please implement me!
    }
    else {
        for (auto& celside : cellsidestack){
            left.SplitConnect(celside);
            
            TPZInterpolatedElement *inteltochange = dynamic_cast<TPZInterpolatedElement *> (celside.Element());
            if (!inteltochange)
                DebugStop();
            inteltochange->SetSideOrient(celside.Side(), 1);
            intelvec[count++] = inteltochange;
        }
    }
    int sideorder = cleft.Order();
    fluxmesh->SetDefaultOrder(sideorder);
            
    // Create HdivBound first for left element
    TPZCompEl *wrapleft;
    TPZManVector<TPZCompEl*> wrapvec(cellsidestack.size());
    {
        for (TPZCompEl* cel : intelvec)
            cel->Reference()->ResetReference();
        intelleft->LoadElementReference();
        intelleft->SetPreferredOrder(sideorder);
        TPZGeoElBC gbc(gleft, fHDivWrapMatid); // creates geoelbc for side
        wrapleft = fluxmesh->ApproxSpace().CreateCompEl(gbc.CreatedElement(), *fluxmesh);
        if(cleft.Order() != sideorder)
        {
            DebugStop();
        }
        TPZInterpolatedElement *intel = dynamic_cast<TPZInterpolatedElement *> (wrapleft);
        int wrapside = gbc.CreatedElement()->NSides() - 1;
        intel->SetSideOrient(wrapside, 1);
        intelleft->Reference()->ResetReference();
        wrapleft->Reference()->ResetReference();
    }
    
    // Create HdivBound then for all others
    intelleft->Reference()->ResetReference();
    int i = 0;
    for (TPZCompElSide celside : cellsidestack) {
        TPZInterpolatedElement* intel = intelvec[i];
        intel->LoadElementReference();
        TPZConnect &con = intel->SideConnect(0, celside.Side());
        int prevorder = con.Order();
        intel->SetPreferredOrder(con.Order());
        
        TPZGeoElSide gelside(celside.Reference());
        TPZGeoElBC gbc(gelside,fHDivWrapMatid);
        TPZCompEl* wrap = fluxmesh->ApproxSpace().CreateCompEl(gbc.CreatedElement(), *fluxmesh);
        wrapvec[i++] = wrap;
        if (con.Order() != prevorder)
            DebugStop();
        
        TPZInterpolatedElement* intelwrap = dynamic_cast<TPZInterpolatedElement*>(wrap);
        int wrapside = gbc.CreatedElement()->NSides()-1;
        intelwrap->SetSideOrient(wrapside, 1);
        intel->Reference()->ResetReference();
        wrap->Reference()->ResetReference();
    }
    wrapleft->LoadElementReference();
    for (TPZCompEl* wrap : wrapvec)
        wrap->LoadElementReference();
    
    int64_t pressureindex;
    int pressureorder;
    int lagmatid = fLagrangeInterface;
    if (isIntersectEnd) {
        lagmatid = fLagrangeInterfaceEnd;
    }
    {
      TPZGeoElBC gbc(gleft, lagmatid);
      pressureindex = gbc.CreatedElement()->Index();
      pressureorder = sideorder;
    }
    
    intelleft->LoadElementReference();
    for (TPZInterpolatedElement* intel : intelvec)
        intel->LoadElementReference();
    
    return std::make_tuple(pressureindex,pressureorder);
}